

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_SwapExtension_Test::TestBody
          (ExtensionSetTest_SwapExtension_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_260;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1b0;
  Message local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  FieldDescriptor *local_a8;
  Reflection *local_a0;
  Reflection *reflection;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  undefined1 local_70 [8];
  TestAllExtensions message2;
  TestAllExtensions message1;
  ExtensionSetTest_SwapExtension_Test *this_local;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_70);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&reflection);
  local_a0 = proto2_unittest::TestAllExtensions::GetReflection();
  Reflection::SwapFields
            (local_a0,(Message *)&message2.field_0._impl_._cached_size_,(Message *)local_70,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&reflection);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>((TestAllExtensions *)local_70)
  ;
  local_a8 = Reflection::FindKnownExtensionByNumber(local_a0,0xc);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)&reflection,&local_a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Reflection::FindKnownExtensionByNumber(local_a0,0x19);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)&reflection,(value_type *)&gtest_ar_.message_);
  Reflection::SwapFields
            (local_a0,(Message *)&message2.field_0._impl_._cached_size_,(Message *)local_70,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&reflection);
  local_c1 = proto2_unittest::TestAllExtensions::
             HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                       ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                         *)&proto2_unittest::optional_int32_extension);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_c0,
               (AssertionResult *)"message1.HasExtension(unittest::optional_int32_extension)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  bVar1 = proto2_unittest::TestAllExtensions::
          HasExtension<google::protobuf::internal::PrimitiveTypeTraits<double>,(unsigned_char)1,false,google::protobuf::internal::PrimitiveTypeTraits<double>>
                    ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                      *)proto2_unittest::optional_double_extension);
  local_109 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_108,
               (AssertionResult *)"message1.HasExtension(unittest::optional_double_extension)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x144,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  bVar1 = proto2_unittest::TestAllExtensions::
          HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                    ((TestAllExtensions *)&message2.field_0._impl_._cached_size_,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                      *)proto2_unittest::optional_cord_extension);
  local_151 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_150,
               (AssertionResult *)"message1.HasExtension(unittest::optional_cord_extension)","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x145,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  bVar1 = proto2_unittest::TestAllExtensions::
          HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                    ((TestAllExtensions *)local_70,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                      *)&proto2_unittest::optional_int32_extension);
  local_199 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_198,
               (AssertionResult *)"message2.HasExtension(unittest::optional_int32_extension)","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x147,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1e1 = proto2_unittest::TestAllExtensions::
              HasExtension<google::protobuf::internal::PrimitiveTypeTraits<double>,(unsigned_char)1,false,google::protobuf::internal::PrimitiveTypeTraits<double>>
                        ((TestAllExtensions *)local_70,
                         (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                          *)proto2_unittest::optional_double_extension);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1e0,
               (AssertionResult *)"message2.HasExtension(unittest::optional_double_extension)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_229 = proto2_unittest::TestAllExtensions::
              HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                        ((TestAllExtensions *)local_70,
                         (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                          *)proto2_unittest::optional_cord_extension);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_260,(internal *)local_228,
               (AssertionResult *)"message2.HasExtension(unittest::optional_cord_extension)","false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)&reflection);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(ExtensionSetTest, SwapExtension) {
  unittest::TestAllExtensions message1;
  unittest::TestAllExtensions message2;

  TestUtil::SetAllExtensions(&message1);
  std::vector<const FieldDescriptor*> fields;

  // Swap empty fields.
  const Reflection* reflection = message1.GetReflection();
  reflection->SwapFields(&message1, &message2, fields);
  TestUtil::ExpectAllExtensionsSet(message1);
  TestUtil::ExpectExtensionsClear(message2);

  // Swap two extensions.
  fields.push_back(reflection->FindKnownExtensionByNumber(12));
  fields.push_back(reflection->FindKnownExtensionByNumber(25));
  reflection->SwapFields(&message1, &message2, fields);

  EXPECT_TRUE(message1.HasExtension(unittest::optional_int32_extension));
  EXPECT_FALSE(message1.HasExtension(unittest::optional_double_extension));
  EXPECT_FALSE(message1.HasExtension(unittest::optional_cord_extension));

  EXPECT_FALSE(message2.HasExtension(unittest::optional_int32_extension));
  EXPECT_TRUE(message2.HasExtension(unittest::optional_double_extension));
  EXPECT_TRUE(message2.HasExtension(unittest::optional_cord_extension));
}